

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbiter.cpp
# Opt level: O2

unique_ptr<unsigned_long,_std::default_delete<unsigned_long>_> __thiscall
arbiter::Arbiter::tryGetSize(Arbiter *this,string *path)

{
  string *in_RDX;
  _Alloc_hider local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  string local_80;
  string local_60;
  string local_40 [32];
  
  ::std::__cxx11::string::string(local_40,in_RDX);
  getDriver((Arbiter *)&local_90,path);
  ::std::__cxx11::string::string((string *)&local_80,in_RDX);
  stripProtocol(&local_60,&local_80);
  (**(code **)(*(long *)local_90._M_p + 0x20))(this,local_90._M_p,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  ::std::__cxx11::string::~string(local_40);
  return (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long>,_true,_true>)
         (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long>,_true,_true>)this;
}

Assistant:

std::unique_ptr<std::size_t> Arbiter::tryGetSize(const std::string path) const
{
    return getDriver(path)->tryGetSize(stripProtocol(path));
}